

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

Vec_Int_t * Wlc_NtkGetBlacks(Wlc_Ntk_t *p,Wlc_Par_t *pPars)

{
  ushort uVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Bit_t *__ptr;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint Entry;
  ulong uVar9;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  __ptr = Wlc_NtkMarkLimit(p,pPars);
  local_38 = 0;
  local_34 = 0;
  local_3c = 0;
  local_40 = 0;
  uVar8 = 0;
  if (1 < p->iObj) {
    uVar8 = 0;
    uVar9 = 1;
    lVar7 = 0x2c;
    local_40 = 0;
    local_3c = 0;
    local_34 = 0;
    local_38 = 0;
    do {
      if ((long)p->nObjsAlloc <= (long)uVar9) goto LAB_00893449;
      pWVar2 = p->pObjs;
      uVar1 = *(ushort *)((long)pWVar2 + lVar7 + -0x14);
      uVar6 = uVar1 & 0x3f;
      Entry = (uint)uVar9;
      if (uVar6 < 0x33) {
        if ((0x1e00000000000U >> uVar6 & 1) == 0) {
          if ((0x4180000000000U >> uVar6 & 1) == 0) {
            if (uVar6 != 8) goto LAB_00893323;
            iVar3 = *(int *)((long)pWVar2 + lVar7 + -0xc) - *(int *)((long)pWVar2 + lVar7 + -8);
            iVar5 = -iVar3;
            if (0 < iVar3) {
              iVar5 = iVar3;
            }
            if (pPars->nBitsMux <= iVar5 + 1) {
              uVar8 = uVar8 + 1;
              if (__ptr != (Vec_Bit_t *)0x0) {
                if ((long)__ptr->nSize <= (long)uVar9) goto LAB_00893468;
                if (((uint)__ptr->pArray[uVar9 >> 5 & 0x7ffffff] >> (Entry & 0x1f) & 1) == 0)
                goto LAB_008933da;
              }
              Vec_IntPushUniqueOrder(p_00,Entry);
              local_3c = local_3c + 1;
            }
          }
          else {
            iVar3 = *(int *)((long)pWVar2 + lVar7 + -0xc) - *(int *)((long)pWVar2 + lVar7 + -8);
            iVar5 = -iVar3;
            if (0 < iVar3) {
              iVar5 = iVar3;
            }
            if (pPars->nBitsAdd <= iVar5 + 1) {
              uVar8 = uVar8 + 1;
              if (__ptr != (Vec_Bit_t *)0x0) {
                if ((long)__ptr->nSize <= (long)uVar9) goto LAB_00893468;
                if (((uint)__ptr->pArray[uVar9 >> 5 & 0x7ffffff] >> (Entry & 0x1f) & 1) == 0)
                goto LAB_008933da;
              }
              Vec_IntPushUniqueOrder(p_00,Entry);
              local_38 = local_38 + 1;
            }
          }
        }
        else {
          iVar3 = *(int *)((long)pWVar2 + lVar7 + -0xc) - *(int *)((long)pWVar2 + lVar7 + -8);
          iVar5 = -iVar3;
          if (0 < iVar3) {
            iVar5 = iVar3;
          }
          if (pPars->nBitsMul <= iVar5 + 1) {
            uVar8 = uVar8 + 1;
            if (__ptr != (Vec_Bit_t *)0x0) {
              if ((long)__ptr->nSize <= (long)uVar9) goto LAB_00893468;
              if (((uint)__ptr->pArray[uVar9 >> 5 & 0x7ffffff] >> (Entry & 0x1f) & 1) == 0)
              goto LAB_008933da;
            }
            Vec_IntPushUniqueOrder(p_00,Entry);
            local_34 = local_34 + 1;
          }
        }
      }
      else {
LAB_00893323:
        if ((short)uVar6 != 1 && (uVar1 & 0x3d) == 1) {
          iVar3 = *(int *)((long)pWVar2 + lVar7 + -0xc) - *(int *)((long)pWVar2 + lVar7 + -8);
          iVar5 = -iVar3;
          if (0 < iVar3) {
            iVar5 = iVar3;
          }
          if (pPars->nBitsFlop <= iVar5 + 1) {
            uVar8 = uVar8 + 1;
            if (__ptr != (Vec_Bit_t *)0x0) {
              if ((long)__ptr->nSize <= (long)uVar9) {
LAB_00893468:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                              ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
              }
              if (((uint)__ptr->pArray[uVar9 >> 5 & 0x7ffffff] >> (Entry & 0x1f) & 1) == 0)
              goto LAB_008933da;
            }
            if ((short)uVar6 != 3) {
              __assert_fail("pObj->Type == WLC_OBJ_FO",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                            ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
            }
            uVar6 = (*(int *)(&pWVar2->field_0x0 + lVar7) + (p->vPos).nSize) - (p->vPis).nSize;
            if (((int)uVar6 < 0) || ((p->vCos).nSize <= (int)uVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar5 = (p->vCos).pArray[uVar6];
            if ((iVar5 < 1) || (p->nObjsAlloc <= iVar5)) {
LAB_00893449:
              __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                            ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
            }
            Vec_IntPushUniqueOrder(p_00,iVar5);
            local_40 = local_40 + 1;
          }
        }
      }
LAB_008933da:
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x18;
    } while ((long)uVar9 < (long)p->iObj);
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  if (pPars->fVerbose != 0) {
    printf("Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away (out of %d signals).\n"
           ,(ulong)local_38,(ulong)local_34,(ulong)local_3c,(ulong)local_40,(ulong)uVar8);
  }
  return p_00;
}

Assistant:

static Vec_Int_t * Wlc_NtkGetBlacks( Wlc_Ntk_t * p, Wlc_Par_t * pPars )
{
    Vec_Int_t * vBlacks = Vec_IntAlloc( 100 ) ;
    Wlc_Obj_t * pObj; int i, Count[4] = {0};
    Vec_Bit_t * vMarks = NULL;
    int nTotal = 0;

    vMarks = Wlc_NtkMarkLimit( p, pPars ) ; 

    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( pObj->Type == WLC_OBJ_ARI_ADD || pObj->Type == WLC_OBJ_ARI_SUB || pObj->Type == WLC_OBJ_ARI_MINUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsAdd )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[0]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[0]++;
            }
            continue;
        }
        if ( pObj->Type == WLC_OBJ_ARI_MULTI || pObj->Type == WLC_OBJ_ARI_DIVIDE || pObj->Type == WLC_OBJ_ARI_REM || pObj->Type == WLC_OBJ_ARI_MODULUS )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMul )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[1]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[1]++;
            }
            continue;
        }
        if ( pObj->Type == WLC_OBJ_MUX )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsMux )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[2]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId(p, pObj) ), Count[2]++;
            }
            continue;
        }
        if ( Wlc_ObjIsCi(pObj) && !Wlc_ObjIsPi(pObj) )
        {
            if ( Wlc_ObjRange(pObj) >= pPars->nBitsFlop )
            {
                ++nTotal;
                if ( vMarks == NULL )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId( p, Wlc_ObjFo2Fi( p, pObj ) ) ), Count[3]++;
                else if ( Vec_BitEntry( vMarks, i ) )
                    Vec_IntPushUniqueOrder( vBlacks, Wlc_ObjId( p, Wlc_ObjFo2Fi( p, pObj ) ) ), Count[3]++;
            }
            continue;
        }
    }
    if ( vMarks )
        Vec_BitFree( vMarks );
    if ( pPars->fVerbose )
        printf( "Abstraction engine marked %d adds/subs, %d muls/divs, %d muxes, and %d flops to be abstracted away (out of %d signals).\n", Count[0], Count[1], Count[2], Count[3], nTotal );
    return vBlacks;
}